

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O0

void __thiscall duckdb::PreparedStatement::~PreparedStatement(PreparedStatement *this)

{
  ErrorData *in_RDI;
  
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)0x88d5ff);
  ErrorData::~ErrorData(in_RDI);
  ::std::__cxx11::string::~string((string *)((in_RDI->raw_message).field_2._M_local_buf + 8));
  shared_ptr<duckdb::PreparedStatementData,_true>::~shared_ptr
            ((shared_ptr<duckdb::PreparedStatementData,_true> *)0x88d629);
  shared_ptr<duckdb::ClientContext,_true>::~shared_ptr
            ((shared_ptr<duckdb::ClientContext,_true> *)0x88d633);
  return;
}

Assistant:

PreparedStatement::~PreparedStatement() {
}